

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::orientationReset
          (DeadReckoningCalculator *this,EulerAngles *Orientation)

{
  undefined8 uVar1;
  TMATRIX *pTVar2;
  KUINT16 i;
  long lVar3;
  TMATRIX *pTVar4;
  TMATRIX *pTVar5;
  long lVar6;
  KFLOAT32 KVar7;
  KFLOAT32 __x;
  KFLOAT32 __x_00;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  (this->m_initOrientation).m_f32Phi = Orientation->m_f32Phi;
  KVar7 = Orientation->m_f32Theta;
  (this->m_initOrientation).m_f32Psi = Orientation->m_f32Psi;
  (this->m_initOrientation).m_f32Theta = KVar7;
  KVar7 = DATA_TYPE::EulerAngles::GetPsiInRadians(Orientation);
  __x = DATA_TYPE::EulerAngles::GetThetaInRadians(Orientation);
  __x_00 = DATA_TYPE::EulerAngles::GetPhiInRadians(Orientation);
  fVar8 = cosf((float)KVar7);
  fVar9 = cosf((float)__x);
  fVar10 = cosf((float)__x_00);
  fVar11 = sinf((float)KVar7);
  fVar12 = sinf((float)__x);
  fVar13 = sinf((float)__x_00);
  (this->m_initOrientationMatrix).Data[0][0] = fVar8 * fVar9;
  (this->m_initOrientationMatrix).Data[0][1] = fVar11 * fVar9;
  (this->m_initOrientationMatrix).Data[0][2] = -fVar12;
  (this->m_initOrientationMatrix).Data[1][0] = fVar13 * fVar8 * fVar12 - fVar10 * fVar11;
  (this->m_initOrientationMatrix).Data[1][1] = fVar13 * fVar12 * fVar11 + fVar8 * fVar10;
  (this->m_initOrientationMatrix).Data[1][2] = fVar13 * fVar9;
  (this->m_initOrientationMatrix).Data[2][0] = fVar8 * fVar12 * fVar10 + fVar11 * fVar13;
  (this->m_initOrientationMatrix).Data[2][1] = fVar12 * fVar11 * fVar10 - fVar8 * fVar13;
  (this->m_initOrientationMatrix).Data[2][2] = fVar9 * fVar10;
  pTVar2 = &this->m_initOrientationMatrixTranspose;
  (this->m_initOrientationMatrixTranspose).Data[2][2] = (this->m_initOrientationMatrix).Data[2][2];
  uVar1 = *(undefined8 *)((this->m_initOrientationMatrix).Data[0] + 2);
  *(undefined8 *)(this->m_initOrientationMatrixTranspose).Data[0] =
       *(undefined8 *)(this->m_initOrientationMatrix).Data[0];
  *(undefined8 *)((this->m_initOrientationMatrixTranspose).Data[0] + 2) = uVar1;
  uVar1 = *(undefined8 *)(this->m_initOrientationMatrix).Data[2];
  *(undefined8 *)((this->m_initOrientationMatrixTranspose).Data[1] + 1) =
       *(undefined8 *)((this->m_initOrientationMatrix).Data[1] + 1);
  *(undefined8 *)(this->m_initOrientationMatrixTranspose).Data[2] = uVar1;
  lVar3 = 0;
  pTVar4 = pTVar2;
  do {
    if (lVar3 != 0) {
      lVar6 = 0;
      pTVar5 = pTVar4;
      do {
        fVar8 = pTVar2->Data[0][lVar6];
        pTVar2->Data[0][lVar6] = pTVar5->Data[0][0];
        pTVar5->Data[0][0] = fVar8;
        lVar6 = lVar6 + 1;
        pTVar5 = (TMATRIX *)(pTVar5->Data + 1);
      } while (lVar3 != lVar6);
    }
    lVar3 = lVar3 + 1;
    pTVar4 = (TMATRIX *)(pTVar4->Data[0] + 1);
    pTVar2 = (TMATRIX *)(pTVar2->Data + 1);
  } while (lVar3 != 3);
  computeRotationAxis(this,&this->m_initOrientationMatrix);
  return;
}

Assistant:

void DeadReckoningCalculator::orientationReset( const EulerAngles & Orientation )
{
    m_initOrientation = Orientation;

    const KFLOAT32 f32Psi = Orientation.GetPsiInRadians();
    const KFLOAT32 f32Theta = Orientation.GetThetaInRadians();
    const KFLOAT32 f32Phi = Orientation.GetPhiInRadians();

    const KFLOAT64 f32CosPsi = cos( f32Psi );
    const KFLOAT64 f32CosTheta = cos( f32Theta );
    const KFLOAT64 f32CosPhi = cos( f32Phi );
    const KFLOAT64 f32SinPsi = sin( f32Psi );
    const KFLOAT64 f32SinTheta = sin( f32Theta );
    const KFLOAT64 f32SinPhi = sin( f32Phi );

    // Create the orientation matrix

    // RI - could use osg mathematics for Euler to rotation matrix computation
    const KFLOAT64 sinTheta_cosPsi = f32SinTheta * f32CosPsi;
    const KFLOAT64 sinTheta_sinPsi = f32SinTheta * f32SinPsi;

    m_initOrientationMatrix.Data[0][0] = f32CosTheta * f32CosPsi;
    m_initOrientationMatrix.Data[0][1] = f32CosTheta * f32SinPsi;
    m_initOrientationMatrix.Data[0][2] = -f32SinTheta;

    m_initOrientationMatrix.Data[1][0] = ( f32SinPhi * sinTheta_cosPsi ) - ( f32CosPhi * f32SinPsi );
    m_initOrientationMatrix.Data[1][1] = ( f32SinPhi * sinTheta_sinPsi ) + ( f32CosPhi * f32CosPsi );
    m_initOrientationMatrix.Data[1][2] = f32SinPhi * f32CosTheta;

    m_initOrientationMatrix.Data[2][0] = ( f32CosPhi * sinTheta_cosPsi ) + ( f32SinPhi * f32SinPsi );
    m_initOrientationMatrix.Data[2][1] = ( f32CosPhi * sinTheta_sinPsi ) - ( f32SinPhi * f32CosPsi );
    m_initOrientationMatrix.Data[2][2] = f32CosPhi * f32CosTheta;

    m_initOrientationMatrixTranspose = m_initOrientationMatrix;
    m_initOrientationMatrixTranspose.inPlanceTranspose();

    computeRotationAxis(m_initOrientationMatrix);
}